

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall argstest::Group::Matched(Group *this)

{
  bool bVar1;
  
  if ((this->validator).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*(this->validator)._M_invoker)((_Any_data *)&this->validator,this);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual bool Matched() const noexcept override
            {
                return validator(*this);
            }